

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::DoAddMember
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value,
          CrtAllocator *allocator)

{
  Number *pNVar1;
  uint uVar2;
  Number NVar3;
  ulong uVar4;
  long lVar5;
  SizeType newCapacity;
  
  uVar2 = (this->data_).s.hashcode;
  if (uVar2 <= (this->data_).s.length) {
    newCapacity = 0x10;
    if (uVar2 != 0) {
      newCapacity = (uVar2 + 1 >> 1) + uVar2;
    }
    DoReserveMembers(this,newCapacity,allocator);
  }
  uVar4 = (ulong)(this->data_).s.str & 0xffffffffffff;
  lVar5 = (ulong)(this->data_).s.length * 0x20;
  NVar3 = (Number)(name->data_).s.str;
  pNVar1 = (Number *)(uVar4 + lVar5);
  *pNVar1 = (name->data_).n;
  pNVar1[1] = NVar3;
  (name->data_).f.flags = 0;
  NVar3 = (Number)(value->data_).s.str;
  pNVar1 = (Number *)(uVar4 + 0x10 + lVar5);
  *pNVar1 = (value->data_).n;
  pNVar1[1] = NVar3;
  (value->data_).f.flags = 0;
  (this->data_).s.length = (this->data_).s.length + 1;
  return;
}

Assistant:

void DoAddMember(GenericValue& name, GenericValue& value, Allocator& allocator) {
        ObjectData& o = data_.o;
        if (o.size >= o.capacity)
            DoReserveMembers(o.capacity ? (o.capacity + (o.capacity + 1) / 2) : kDefaultObjectCapacity, allocator);
        Member* members = GetMembersPointer();
        Member* m = members + o.size;
        m->name.RawAssign(name);
        m->value.RawAssign(value);
#if RAPIDJSON_USE_MEMBERSMAP
        Map* &map = GetMap(members);
        MapIterator* mit = GetMapIterators(map);
        new (&mit[o.size]) MapIterator(map->insert(MapPair(m->name.data_, o.size)));
#endif
        ++o.size;
    }